

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  short sVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  ImU32 tab_id;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float _x;
  ImVec2 IVar13;
  ImGuiID local_1b8;
  ImGuiCol local_1b4;
  ImGuiCol local_1b0;
  bool local_1aa;
  bool local_1a9;
  bool local_156;
  bool local_155;
  ImGuiID local_154;
  bool text_clipped;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImDrawList *pIStack_148;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  ImVec2 local_138;
  byte local_12f;
  bool local_12e;
  bool local_12d;
  uint local_12c;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 IStack_128;
  ImGuiButtonFlags button_flags;
  ImVec2 local_120;
  ImVec2 backup_cursor_max_pos;
  ImVec2 local_10c;
  bool local_101;
  ImVec2 IStack_100;
  bool want_clip_rect;
  undefined1 local_f8 [8];
  ImRect bb;
  ImVec2 pos;
  ImVec2 local_d0;
  ImVec2 local_c8;
  byte local_bd;
  ImVec2 IStack_bc;
  bool is_central_section;
  ImVec2 backup_main_cursor_pos;
  undefined1 local_9c [3];
  bool tab_contents_visible;
  bool is_tab_button;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  byte local_71;
  ImGuiTabItem *pIStack_70;
  bool tab_is_new;
  ImGuiTabItem *tab;
  float fStack_60;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool *pbStack_28;
  ImGuiTabItemFlags flags_local;
  bool *p_open_local;
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab_bar->WantLayout & 1U) != 0) {
    TabBarLayout(tab_bar);
  }
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((pIVar3->SkipItems & 1U) == 0) {
    tab_id = TabBarCalcTabID(tab_bar,label);
    if ((p_open == (bool *)0x0) || ((*p_open & 1U) != 0)) {
      if (p_open != (bool *)0x0 && (flags & 0x200000U) != 0) {
        __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                      ,0x1ef8,
                      "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)"
                     );
      }
      if ((flags & 0xc0U) == 0xc0) {
        __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                      ,0x1ef9,
                      "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)"
                     );
      }
      g._4_4_ = flags;
      if ((flags & 0x100000U) == 0) {
        pbStack_28 = p_open;
        if (p_open == (bool *)0x0) {
          g._4_4_ = flags | 0x100000;
        }
      }
      else {
        pbStack_28 = (bool *)0x0;
      }
      register0x00001200 = TabItemCalcSize(label,pbStack_28 != (bool *)0x0);
      pIStack_70 = TabBarFindTabByID(tab_bar,tab_id);
      local_71 = 0;
      bVar10 = pIStack_70 == (ImGuiTabItem *)0x0;
      if (bVar10) {
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)local_9c);
        ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)local_9c);
        pIStack_70 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
        pIStack_70->ID = tab_id;
        pIStack_70->Width = tab._4_4_;
        tab_bar->TabsAddedNew = true;
      }
      local_71 = bVar10;
      iVar6 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIStack_70);
      tab_bar->LastTabItemIdx = (ImS16)iVar6;
      pIStack_70->ContentWidth = tab._4_4_;
      sVar2 = tab_bar->TabsActiveCount;
      tab_bar->TabsActiveCount = sVar2 + 1;
      pIStack_70->BeginOrder = sVar2;
      bVar10 = tab_bar->PrevFrameVisible + 1 < pIVar5->FrameCount;
      bVar11 = (tab_bar->Flags & 0x200000U) != 0;
      bVar4 = pIStack_70->LastFrameVisible + 1 < pIVar5->FrameCount;
      bVar12 = (g._4_4_ & 0x200000) != 0;
      pIStack_70->LastFrameVisible = pIVar5->FrameCount;
      pIStack_70->Flags = g._4_4_;
      iVar6 = ImGuiTextBuffer::size(&tab_bar->TabsNames);
      pIStack_70->NameOffset = iVar6;
      sVar8 = strlen(label);
      ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar8 + 1);
      if ((((bVar4) && ((tab_bar->Flags & 2U) != 0)) && (tab_bar->NextSelectedTabId == 0)) &&
         (((!bVar10 || (tab_bar->SelectedTabId == 0)) && (!bVar12)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      if ((((g._4_4_ & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) && (!bVar12)) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      tab_bar_local._7_1_ = tab_bar->VisibleTabId == tab_id;
      if (tab_bar_local._7_1_) {
        tab_bar->VisibleTabWasSubmitted = true;
      }
      else if ((((tab_bar->SelectedTabId == 0) && (bVar10)) && ((tab_bar->Tabs).Size == 1)) &&
              ((tab_bar->Flags & 2U) == 0)) {
        tab_bar_local._7_1_ = true;
      }
      if ((!bVar4) || ((bVar10 && ((local_71 & 1) == 0)))) {
        if (tab_bar->SelectedTabId == tab_id) {
          pIStack_70->LastFrameSelected = pIVar5->FrameCount;
        }
        IStack_bc = (pIVar3->DC).CursorPos;
        local_bd = (pIStack_70->Flags & 0xc0U) == 0;
        stack0xffffffffffffff9c = (ImVec2)CONCAT44(fStack_60,pIStack_70->Width);
        if ((bool)local_bd) {
          ImVec2::ImVec2(&local_d0,(float)(int)(pIStack_70->Offset - tab_bar->ScrollingAnim),0.0);
          local_c8 = operator+(&(tab_bar->BarRect).Min,&local_d0);
          (pIVar3->DC).CursorPos = local_c8;
        }
        else {
          ImVec2::ImVec2(&pos,pIStack_70->Offset,0.0);
          IVar13 = operator+(&(tab_bar->BarRect).Min,&pos);
          (pIVar3->DC).CursorPos = IVar13;
        }
        bb.Max = (pIVar3->DC).CursorPos;
        IStack_100 = operator+(&bb.Max,(ImVec2 *)((long)&tab + 4));
        ImRect::ImRect((ImRect *)local_f8,&bb.Max,&stack0xffffffffffffff00);
        local_1a9 = false;
        if ((local_bd & 1) != 0) {
          local_1aa = true;
          if (tab_bar->ScrollingRectMinX <= (float)local_f8._0_4_) {
            local_1aa = tab_bar->ScrollingRectMaxX <= bb.Min.x &&
                        bb.Min.x != tab_bar->ScrollingRectMaxX;
          }
          local_1a9 = local_1aa;
        }
        local_101 = local_1a9;
        if (local_1a9 != false) {
          _x = ImMax<float>((float)local_f8._0_4_,tab_bar->ScrollingRectMinX);
          ImVec2::ImVec2(&local_10c,_x,(float)local_f8._4_4_ - 1.0);
          ImVec2::ImVec2((ImVec2 *)&backup_cursor_max_pos.y,tab_bar->ScrollingRectMaxX,bb.Min.y);
          PushClipRect(&local_10c,(ImVec2 *)&backup_cursor_max_pos.y,true);
        }
        local_120 = (pIVar3->DC).CursorMaxPos;
        IStack_128 = ImRect::GetSize((ImRect *)local_f8);
        ItemSize(&stack0xfffffffffffffed8,(pIVar5->Style).FramePadding.y);
        (pIVar3->DC).CursorMaxPos = local_120;
        bVar10 = ItemAdd((ImRect *)local_f8,tab_id,(ImRect *)0x0,0);
        if (bVar10) {
          uVar7 = 0x10;
          if (bVar12) {
            uVar7 = 0x20;
          }
          local_12c = uVar7 | 0x1000;
          if ((pIVar5->DragDropActive & 1U) != 0) {
            local_12c = uVar7 | 0x1200;
          }
          local_12f = ButtonBehavior((ImRect *)local_f8,tab_id,&local_12d,&local_12e,local_12c);
          if (((bool)local_12f) && (!bVar12)) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          if (pIVar5->ActiveId != tab_id) {
            SetItemAllowOverlap();
          }
          if (((((local_12e & 1U) != 0) && (!bVar4)) && (bVar10 = IsMouseDragging(0,-1.0), bVar10))
             && (((pIVar5->DragDropActive & 1U) == 0 && ((tab_bar->Flags & 1U) != 0)))) {
            pIVar1 = &(pIVar5->IO).MouseDelta;
            if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
               ((float)local_f8._0_4_ <= (pIVar5->IO).MousePos.x)) {
              if ((0.0 < (pIVar5->IO).MouseDelta.x) && (bb.Min.x < (pIVar5->IO).MousePos.x)) {
                display_draw_list = *(ImDrawList **)&(pIVar5->IO).MousePos;
                TabBarQueueReorderFromMousePos(tab_bar,pIStack_70,(ImVec2)display_draw_list);
              }
            }
            else {
              local_138 = (pIVar5->IO).MousePos;
              TabBarQueueReorderFromMousePos(tab_bar,pIStack_70,local_138);
            }
          }
          pIStack_148 = pIVar3->DrawList;
          if (((local_12e & 1U) == 0) && ((local_12d & 1U) == 0)) {
            if (tab_bar_local._7_1_ == false) {
              local_1b4 = 0x24;
              if (bVar11) {
                local_1b4 = 0x21;
              }
            }
            else {
              local_1b4 = 0x25;
              if (bVar11) {
                local_1b4 = 0x23;
              }
            }
            local_1b0 = local_1b4;
          }
          else {
            local_1b0 = 0x22;
          }
          close_button_id = GetColorU32(local_1b0,1.0);
          TabItemBackground(pIStack_148,(ImRect *)local_f8,g._4_4_,close_button_id);
          RenderNavHighlight((ImRect *)local_f8,tab_id,1);
          just_closed = IsItemHovered(0x20);
          if ((just_closed) &&
             (((bVar10 = IsMouseClicked(1,false), bVar10 || (bVar10 = IsMouseReleased(1), bVar10))
              && (!bVar12)))) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          if ((tab_bar->Flags & 8U) != 0) {
            g._4_4_ = g._4_4_ | 4;
          }
          if (pbStack_28 == (bool *)0x0) {
            local_1b8 = 0;
          }
          else {
            local_1b8 = GetIDWithSeed("#CLOSE",(char *)0x0,tab_id);
          }
          local_154 = local_1b8;
          TabItemLabelAndCloseButton
                    (pIStack_148,(ImRect *)local_f8,g._4_4_,tab_bar->FramePadding,label,tab_id,
                     local_1b8,tab_bar_local._7_1_,&local_155,&local_156);
          if (((local_155 & 1U) != 0) && (pbStack_28 != (bool *)0x0)) {
            *pbStack_28 = false;
            TabBarCloseTab(tab_bar,pIStack_70);
          }
          if ((local_101 & 1U) != 0) {
            PopClipRect();
          }
          (pIVar3->DC).CursorPos = IStack_bc;
          if (((((local_156 & 1U) != 0) && (pIVar5->HoveredId == tab_id)) &&
              (((local_12e & 1U) == 0 &&
               (((pIVar5->TooltipSlowDelay <= pIVar5->HoveredIdNotActiveTimer &&
                  pIVar5->HoveredIdNotActiveTimer != pIVar5->TooltipSlowDelay &&
                 (bVar10 = IsItemHovered(0), bVar10)) && ((tab_bar->Flags & 0x20U) == 0)))))) &&
             ((pIStack_70->Flags & 0x10U) == 0)) {
            pcVar9 = FindRenderedTextEnd(label,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar9 - (int)label),label);
          }
          bVar10 = true;
          if (bVar12) {
            bVar10 = tab_bar->SelectedTabId != pIStack_70->ID || !bVar12;
          }
          if (!bVar10) {
            __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                          "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                          ,0x1fae,
                          "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)"
                         );
          }
          if (bVar12) {
            tab_bar_local._7_1_ = (bool)(local_12f & 1);
          }
        }
        else {
          if ((local_101 & 1U) != 0) {
            PopClipRect();
          }
          (pIVar3->DC).CursorPos = IStack_bc;
        }
      }
      else {
        ImRect::ImRect((ImRect *)&backup_main_cursor_pos);
        ItemAdd((ImRect *)&backup_main_cursor_pos,tab_id,(ImRect *)0x0,0x18);
        if (bVar12) {
          tab_bar_local._7_1_ = false;
        }
      }
    }
    else {
      ImRect::ImRect((ImRect *)&size);
      ItemAdd((ImRect *)&size,tab_id,(ImRect *)0x0,0x18);
      tab_bar_local._7_1_ = false;
    }
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}